

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_result_zeroblob64(sqlite3_context *pCtx,u64 n)

{
  if ((ulong)(long)pCtx->pOut->db->aLimit[0] < n) {
    return 0x12;
  }
  sqlite3VdbeMemSetZeroBlob(pCtx->pOut,(int)n);
  return 0;
}

Assistant:

SQLITE_API int sqlite3_result_zeroblob64(sqlite3_context *pCtx, u64 n){
  Mem *pOut = pCtx->pOut;
  assert( sqlite3_mutex_held(pOut->db->mutex) );
  if( n>(u64)pOut->db->aLimit[SQLITE_LIMIT_LENGTH] ){
    return SQLITE_TOOBIG;
  }
  sqlite3VdbeMemSetZeroBlob(pCtx->pOut, (int)n);
  return SQLITE_OK;
}